

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

double __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
::reinit(best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
         *this,local_context *ctx,bool param_2,double kappa_min,double kappa_max,bit_array *x)

{
  uint uVar1;
  pointer pdVar2;
  double dVar3;
  double *in_R9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  double kappa;
  double local_38;
  double local_30;
  double local_28;
  uint *puVar4;
  
  puVar4 = &ctx->thread_id;
  fmt._M_str = (char *)puVar4;
  fmt._M_len = (size_t)"- reinitinialization thread {}.\n";
  local_30 = kappa_max;
  local_28 = kappa_min;
  to_log<unsigned_int>(_stdout,(FILE *)0x3,0x20,fmt,(uint *)in_R9);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_28;
  local_38 = local_28;
  uVar1 = ctx->thread_id;
  pdVar2 = (this->m_kappa_append).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ctx->init_kappa_improve_stop <= pdVar2[uVar1]) {
    pdVar2[uVar1] = ctx->init_kappa_improve_start;
    storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::minimize_tag>::crossover
              (&this->m_storage,ctx,x);
    fmt_01._M_str = (char *)puVar4;
    fmt_01._M_len = (size_t)"- crossover\n";
    to_log<>(_stdout,(FILE *)0x5,0xc,fmt_01);
  }
  else {
    dVar3 = pdVar2[uVar1] + ctx->init_kappa_improve_increase;
    pdVar2[uVar1] = dVar3;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_30 - local_28;
    auVar7 = vfmadd213sd_fma(auVar6,auVar5,auVar7);
    local_38 = auVar7._0_8_;
    fmt_00._M_str = (char *)&local_38;
    fmt_00._M_len = (size_t)"- improve with kappa {}\n";
    to_log<double>(_stdout,(FILE *)0x5,0x18,fmt_00,in_R9);
  }
  mutation(this,ctx,x);
  return local_38;
}

Assistant:

double reinit(local_context& ctx,
                  const bool /*is_solution*/,
                  const double kappa_min,
                  const double kappa_max,
                  bit_array& x)
    {
        to_log(stdout, 3u, "- reinitinialization thread {}.\n", ctx.thread_id);

        double kappa = kappa_min;

        if (m_kappa_append[ctx.thread_id] < ctx.init_kappa_improve_stop) {
            m_kappa_append[ctx.thread_id] += ctx.init_kappa_improve_increase;
            kappa = kappa_min +
                    (kappa_max - kappa_min) * m_kappa_append[ctx.thread_id];

            to_log(stdout, 5u, "- improve with kappa {}\n", kappa);
        } else {
            m_kappa_append[ctx.thread_id] = ctx.init_kappa_improve_start;
            crossover(ctx, x);

            to_log(stdout, 5u, "- crossover\n");
        }

        mutation(ctx, x);

        return kappa;
    }